

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanOrder.c
# Opt level: O1

void Abc_NtkOrderFaninsByLitCount(Abc_Ntk_t *pNtk)

{
  ulong uVar1;
  char *pcVar2;
  size_t __size;
  char cVar3;
  char *pSop;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  Vec_Int_t *p;
  int *piVar7;
  void *pvVar8;
  uint *__ptr;
  Vec_Int_t *p_00;
  int *piVar9;
  Vec_Ptr_t *pVVar10;
  void *pvVar11;
  long lVar12;
  char *pcVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  uint Entry;
  ulong uVar17;
  ulong uVar18;
  char *pcVar19;
  ulong __n;
  
  if (pNtk->ntkFunc != ABC_FUNC_SOP) {
    __assert_fail("Abc_NtkHasSop(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcFanOrder.c"
                  ,100,"void Abc_NtkOrderFaninsByLitCount(Abc_Ntk_t *)");
  }
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar7 = (int *)malloc(400);
  p->pArray = piVar7;
  piVar7 = (int *)malloc(0x10);
  piVar7[0] = 100;
  piVar7[1] = 0;
  pvVar8 = malloc(100);
  *(void **)(piVar7 + 2) = pvVar8;
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 100;
  __ptr[1] = 0;
  pvVar8 = malloc(400);
  *(void **)(__ptr + 2) = pvVar8;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar9 = (int *)malloc(400);
  p_00->pArray = piVar9;
  pVVar10 = pNtk->vObjs;
  if (0 < pVVar10->nSize) {
    lVar16 = 0;
    do {
      pvVar8 = pVVar10->pArray[lVar16];
      if ((pvVar8 != (void *)0x0) && ((*(uint *)((long)pvVar8 + 0x14) & 0xf) == 7)) {
        pSop = *(char **)((long)pvVar8 + 0x38);
        uVar5 = Abc_SopGetVarNum(pSop);
        if (uVar5 != *(uint *)((long)pvVar8 + 0x1c)) {
          __assert_fail("nVars == Abc_ObjFaninNum(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcFanOrder.c"
                        ,0x6d,"void Abc_NtkOrderFaninsByLitCount(Abc_Ntk_t *)");
        }
        if ((int)*__ptr < (int)uVar5) {
          __size = (long)(int)uVar5 * 4;
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar11 = malloc(__size);
          }
          else {
            pvVar11 = realloc(*(void **)(__ptr + 2),__size);
          }
          *(void **)(__ptr + 2) = pvVar11;
          if (pvVar11 == (void *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          *__ptr = uVar5;
        }
        __n = (ulong)uVar5;
        if (0 < (int)uVar5) {
          memset(*(void **)(__ptr + 2),0,__n * 4);
        }
        __ptr[1] = uVar5;
        if (*pSop != '\0') {
          pcVar13 = pSop;
          do {
            if (0 < (int)uVar5) {
              uVar15 = 0;
              do {
                if (pcVar13[uVar15] != '-') {
                  piVar9 = (int *)(*(long *)(__ptr + 2) + uVar15 * 4);
                  *piVar9 = *piVar9 + 1;
                }
                uVar15 = uVar15 + 1;
              } while (__n != uVar15);
            }
            pcVar19 = pcVar13 + (int)(uVar5 + 3);
            pcVar13 = pcVar13 + (int)(uVar5 + 3);
          } while (*pcVar19 != '\0');
        }
        p->nSize = 0;
        if (0 < (int)uVar5) {
          Entry = 0;
          do {
            Vec_IntPush(p,Entry);
            Entry = Entry + 1;
          } while (uVar5 != Entry);
        }
        piVar9 = p->pArray;
        if (1 < (int)uVar5) {
          uVar14 = 1;
          uVar15 = 0;
          do {
            uVar1 = uVar15 + 1;
            uVar18 = uVar15 & 0xffffffff;
            uVar17 = uVar14;
            do {
              if ((uVar5 <= (uint)piVar9[uVar17]) || (uVar5 <= (uint)piVar9[(int)uVar18])) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                              ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              uVar4 = uVar17 & 0xffffffff;
              if (*(int *)(*(long *)(__ptr + 2) + (ulong)(uint)piVar9[(int)uVar18] * 4) <=
                  *(int *)(*(long *)(__ptr + 2) + (ulong)(uint)piVar9[uVar17] * 4)) {
                uVar4 = uVar18;
              }
              uVar18 = uVar4;
              uVar17 = uVar17 + 1;
            } while (__n != uVar17);
            iVar6 = piVar9[uVar15];
            piVar9[uVar15] = piVar9[(int)uVar18];
            piVar9[(int)uVar18] = iVar6;
            uVar14 = uVar14 + 1;
            uVar15 = uVar1;
          } while (uVar1 != uVar5 - 1);
        }
        iVar6 = Abc_SopGetCubeNum(pSop);
        lVar12 = (long)(int)uVar5 + 3;
        iVar6 = iVar6 * (int)lVar12;
        if (*piVar7 <= iVar6) {
          iVar6 = iVar6 + 1;
          if (*(void **)(piVar7 + 2) == (void *)0x0) {
            pvVar11 = malloc((long)iVar6);
          }
          else {
            pvVar11 = realloc(*(void **)(piVar7 + 2),(long)iVar6);
          }
          *(void **)(piVar7 + 2) = pvVar11;
          *piVar7 = iVar6;
        }
        pcVar13 = *(char **)(piVar7 + 2);
        iVar6 = Abc_SopGetCubeNum(pSop);
        memcpy(pcVar13,pSop,(long)(iVar6 * (int)lVar12 + 1));
        cVar3 = *pcVar13;
        pcVar19 = pSop;
        while (cVar3 != '\0') {
          if (0 < (int)uVar5) {
            memset(pcVar19,0x2d,__n);
            uVar15 = 0;
            do {
              if ((pcVar13[piVar9[uVar15]] & 0xfeU) == 0x30) {
                pcVar19[uVar15] = pcVar13[piVar9[uVar15]];
              }
              uVar15 = uVar15 + 1;
            } while (__n != uVar15);
          }
          pcVar19 = pcVar19 + lVar12;
          pcVar2 = pcVar13 + lVar12;
          pcVar13 = pcVar13 + lVar12;
          cVar3 = *pcVar2;
        }
        *(char **)((long)pvVar8 + 0x38) = pSop;
        p_00->nSize = 0;
        if (0 < (int)uVar5) {
          uVar15 = 0;
          do {
            Vec_IntPush(p_00,*(int *)(*(long *)((long)pvVar8 + 0x20) + (long)piVar9[uVar15] * 4));
            uVar15 = uVar15 + 1;
          } while (__n != uVar15);
        }
        *(undefined4 *)((long)pvVar8 + 0x1c) = 0;
        iVar6 = p_00->nSize;
        if (0 < (long)iVar6) {
          piVar9 = p_00->pArray;
          lVar12 = 0;
          do {
            Vec_IntPush((Vec_Int_t *)((long)pvVar8 + 0x18),piVar9[lVar12]);
            lVar12 = lVar12 + 1;
          } while (iVar6 != lVar12);
        }
      }
      lVar16 = lVar16 + 1;
      pVVar10 = pNtk->vObjs;
    } while (lVar16 < pVVar10->nSize);
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
    p->pArray = (int *)0x0;
  }
  free(p);
  if (*(void **)(piVar7 + 2) != (void *)0x0) {
    free(*(void **)(piVar7 + 2));
    piVar7[2] = 0;
    piVar7[3] = 0;
  }
  free(piVar7);
  return;
}

Assistant:

void Abc_NtkOrderFaninsByLitCount( Abc_Ntk_t * pNtk )
{
    Vec_Int_t * vOrder;
    Vec_Int_t * vCounts;
    Vec_Int_t * vFanins;
    Vec_Str_t * vStore;
    Abc_Obj_t * pNode;
    char * pSop, * pSopNew;
    char * pCube, * pCubeNew;
    int nVars, i, v, * pOrder;
    assert( Abc_NtkHasSop(pNtk) );
    vOrder = Vec_IntAlloc( 100 );
    vStore = Vec_StrAlloc( 100 );
    vCounts = Vec_IntAlloc( 100 );
    vFanins = Vec_IntAlloc( 100 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        pSop = (char *)pNode->pData;
        nVars = Abc_SopGetVarNum(pSop);
        assert( nVars == Abc_ObjFaninNum(pNode) );
        // count literals
        Vec_IntFill( vCounts, nVars, 0 );
        Abc_SopForEachCube( pSop, nVars, pCube )
            for ( v = 0; v < nVars; v++ )
                if ( pCube[v] != '-' )
                    Vec_IntAddToEntry( vCounts, v, 1 );
        // find good order
        Vec_IntClear( vOrder );
        for ( v = 0; v < nVars; v++ )
            Vec_IntPush( vOrder, v );
        pOrder = Vec_IntArray(vOrder);
        Vec_IntSelectSortCost( pOrder, nVars, vCounts );
        // copy the cover
        Vec_StrGrow( vStore, Abc_SopGetCubeNum(pSop) * (nVars + 3) + 1 );
        memcpy( Vec_StrArray(vStore), pSop, Abc_SopGetCubeNum(pSop) * (nVars + 3) + 1 );
        pSopNew = pCubeNew = pSop;
        pSop = Vec_StrArray(vStore);
        // generate permuted one
        Abc_SopForEachCube( pSop, nVars, pCube )
        {
            for ( v = 0; v < nVars; v++ )
                pCubeNew[v] = '-';
            for ( v = 0; v < nVars; v++ )
                if ( pCube[pOrder[v]] == '0' )
                    pCubeNew[v] = '0';
                else if ( pCube[pOrder[v]] == '1' )
                    pCubeNew[v] = '1';
            pCubeNew += nVars + 3;
        }
        pNode->pData = pSopNew;
        // generate the fanin order
        Vec_IntClear( vFanins );
        for ( v = 0; v < nVars; v++ )
            Vec_IntPush( vFanins, Abc_ObjFaninId( pNode, pOrder[v] ) );
        Vec_IntClear( &pNode->vFanins );
        Vec_IntAppend( &pNode->vFanins, vFanins );
    }
    Vec_IntFree( vFanins );
    Vec_IntFree( vCounts );
    Vec_IntFree( vOrder );
    Vec_StrFree( vStore );
}